

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O2

void __thiscall icu_63::RBBITableBuilder::removeColumn(RBBITableBuilder *this,int32_t column)

{
  void *pvVar1;
  int index;
  int iVar2;
  
  iVar2 = this->fDStates->count;
  index = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
    index = 0;
  }
  for (; iVar2 != index; index = index + 1) {
    pvVar1 = UVector::elementAt(this->fDStates,index);
    UVector32::removeElementAt(*(UVector32 **)((long)pvVar1 + 0x28),column);
  }
  return;
}

Assistant:

void RBBITableBuilder::removeColumn(int32_t column) {
    int32_t numStates = fDStates->size();
    for (int32_t state=0; state<numStates; state++) {
        RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(state);
        U_ASSERT(column < sd->fDtran->size());
        sd->fDtran->removeElementAt(column);
    }
}